

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O0

void __thiscall wasm::DataFlow::Printer::printExpression(Printer *this,Node *node)

{
  UnaryOp UVar1;
  bool bVar2;
  Unary *pUVar3;
  Node *pNVar4;
  Binary *pBVar5;
  Node *right;
  Node *left;
  Binary *binary;
  Node *value;
  Unary *unary;
  Literal local_40;
  Const *local_28;
  Const *c;
  Expression *curr;
  Node *node_local;
  Printer *this_local;
  
  curr = (Expression *)node;
  node_local = (Node *)this;
  bVar2 = Node::isExpr(node);
  if (!bVar2) {
    __assert_fail("node->isExpr()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x219,"void wasm::DataFlow::Printer::printExpression(Node *)");
  }
  c = (Const *)(curr->type).id;
  local_28 = Expression::dynCast<wasm::Const>((Expression *)c);
  if (local_28 == (Const *)0x0) {
    pUVar3 = Expression::dynCast<wasm::Unary>((Expression *)c);
    if (pUVar3 == (Unary *)0x0) {
      pBVar5 = Expression::dynCast<wasm::Binary>((Expression *)c);
      if (pBVar5 == (Binary *)0x0) {
        bVar2 = Expression::is<wasm::Select>((Expression *)c);
        if (!bVar2) {
          handle_unreachable("unexecpted node type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                             ,0x299);
        }
        std::operator<<((ostream *)&std::cout,"select ");
        pNVar4 = Node::getValue((Node *)curr,0);
        printInternal(this,pNVar4);
        std::operator<<((ostream *)&std::cout,", ");
        pNVar4 = Node::getValue((Node *)curr,1);
        printInternal(this,pNVar4);
        std::operator<<((ostream *)&std::cout,", ");
        pNVar4 = Node::getValue((Node *)curr,2);
        printInternal(this,pNVar4);
      }
      else {
        switch(pBVar5->op) {
        case AddInt32:
        case AddInt64:
          std::operator<<((ostream *)&std::cout,"add");
          break;
        case SubInt32:
        case SubInt64:
          std::operator<<((ostream *)&std::cout,"sub");
          break;
        case MulInt32:
        case MulInt64:
          std::operator<<((ostream *)&std::cout,"mul");
          break;
        case DivSInt32:
        case DivSInt64:
          std::operator<<((ostream *)&std::cout,"sdiv");
          break;
        case DivUInt32:
        case DivUInt64:
          std::operator<<((ostream *)&std::cout,"udiv");
          break;
        case RemSInt32:
        case RemSInt64:
          std::operator<<((ostream *)&std::cout,"srem");
          break;
        case RemUInt32:
        case RemUInt64:
          std::operator<<((ostream *)&std::cout,"urem");
          break;
        case AndInt32:
        case AndInt64:
          std::operator<<((ostream *)&std::cout,"and");
          break;
        case OrInt32:
        case OrInt64:
          std::operator<<((ostream *)&std::cout,"or");
          break;
        case XorInt32:
        case XorInt64:
          std::operator<<((ostream *)&std::cout,"xor");
          break;
        case ShlInt32:
        case ShlInt64:
          std::operator<<((ostream *)&std::cout,"shl");
          break;
        case ShrSInt32:
        case ShrSInt64:
          std::operator<<((ostream *)&std::cout,"ashr");
          break;
        case ShrUInt32:
        case ShrUInt64:
          std::operator<<((ostream *)&std::cout,"lshr");
          break;
        case RotLInt32:
        case RotLInt64:
          std::operator<<((ostream *)&std::cout,"rotl");
          break;
        case RotRInt32:
        case RotRInt64:
          std::operator<<((ostream *)&std::cout,"rotr");
          break;
        case EqInt32:
        case EqInt64:
          std::operator<<((ostream *)&std::cout,"eq");
          break;
        case NeInt32:
        case NeInt64:
          std::operator<<((ostream *)&std::cout,"ne");
          break;
        case LtSInt32:
        case LtSInt64:
          std::operator<<((ostream *)&std::cout,"slt");
          break;
        case LtUInt32:
        case LtUInt64:
          std::operator<<((ostream *)&std::cout,"ult");
          break;
        case LeSInt32:
        case LeSInt64:
          std::operator<<((ostream *)&std::cout,"sle");
          break;
        case LeUInt32:
        case LeUInt64:
          std::operator<<((ostream *)&std::cout,"ule");
          break;
        default:
          handle_unreachable("invalid op",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                             ,0x289);
        }
        std::operator<<((ostream *)&std::cout,' ');
        pNVar4 = Node::getValue((Node *)curr,0);
        printInternal(this,pNVar4);
        std::operator<<((ostream *)&std::cout,", ");
        pNVar4 = Node::getValue((Node *)curr,1);
        printInternal(this,pNVar4);
      }
    }
    else {
      UVar1 = pUVar3->op;
      if (UVar1 < CtzInt32) {
        std::operator<<((ostream *)&std::cout,"ctlz");
      }
      else if (UVar1 - CtzInt32 < 2) {
        std::operator<<((ostream *)&std::cout,"cttz");
      }
      else {
        if (1 < UVar1 - PopcntInt32) {
          handle_unreachable("invalid op",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                             ,0x22d);
        }
        std::operator<<((ostream *)&std::cout,"ctpop");
      }
      std::operator<<((ostream *)&std::cout,' ');
      pNVar4 = Node::getValue((Node *)curr,0);
      printInternal(this,pNVar4);
    }
  }
  else {
    wasm::Literal::Literal(&local_40,&local_28->value);
    print(this,&local_40);
    wasm::Literal::~Literal(&local_40);
  }
  return;
}

Assistant:

void printExpression(Node* node) {
    assert(node->isExpr());
    // TODO use a Visitor here?
    auto* curr = node->expr;
    if (auto* c = curr->dynCast<Const>()) {
      print(c->value);
    } else if (auto* unary = curr->dynCast<Unary>()) {
      switch (unary->op) {
        case ClzInt32:
        case ClzInt64:
          std::cout << "ctlz";
          break;
        case CtzInt32:
        case CtzInt64:
          std::cout << "cttz";
          break;
        case PopcntInt32:
        case PopcntInt64:
          std::cout << "ctpop";
          break;
        default:
          WASM_UNREACHABLE("invalid op");
      }
      std::cout << ' ';
      auto* value = node->getValue(0);
      printInternal(value);
    } else if (auto* binary = curr->dynCast<Binary>()) {
      switch (binary->op) {
        case AddInt32:
        case AddInt64:
          std::cout << "add";
          break;
        case SubInt32:
        case SubInt64:
          std::cout << "sub";
          break;
        case MulInt32:
        case MulInt64:
          std::cout << "mul";
          break;
        case DivSInt32:
        case DivSInt64:
          std::cout << "sdiv";
          break;
        case DivUInt32:
        case DivUInt64:
          std::cout << "udiv";
          break;
        case RemSInt32:
        case RemSInt64:
          std::cout << "srem";
          break;
        case RemUInt32:
        case RemUInt64:
          std::cout << "urem";
          break;
        case AndInt32:
        case AndInt64:
          std::cout << "and";
          break;
        case OrInt32:
        case OrInt64:
          std::cout << "or";
          break;
        case XorInt32:
        case XorInt64:
          std::cout << "xor";
          break;
        case ShlInt32:
        case ShlInt64:
          std::cout << "shl";
          break;
        case ShrUInt32:
        case ShrUInt64:
          std::cout << "lshr";
          break;
        case ShrSInt32:
        case ShrSInt64:
          std::cout << "ashr";
          break;
        case RotLInt32:
        case RotLInt64:
          std::cout << "rotl";
          break;
        case RotRInt32:
        case RotRInt64:
          std::cout << "rotr";
          break;
        case EqInt32:
        case EqInt64:
          std::cout << "eq";
          break;
        case NeInt32:
        case NeInt64:
          std::cout << "ne";
          break;
        case LtSInt32:
        case LtSInt64:
          std::cout << "slt";
          break;
        case LtUInt32:
        case LtUInt64:
          std::cout << "ult";
          break;
        case LeSInt32:
        case LeSInt64:
          std::cout << "sle";
          break;
        case LeUInt32:
        case LeUInt64:
          std::cout << "ule";
          break;
        default:
          WASM_UNREACHABLE("invalid op");
      }
      std::cout << ' ';
      auto* left = node->getValue(0);
      printInternal(left);
      std::cout << ", ";
      auto* right = node->getValue(1);
      printInternal(right);
    } else if (curr->is<Select>()) {
      std::cout << "select ";
      printInternal(node->getValue(0));
      std::cout << ", ";
      printInternal(node->getValue(1));
      std::cout << ", ";
      printInternal(node->getValue(2));
    } else {
      WASM_UNREACHABLE("unexecpted node type");
    }
  }